

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int P_StartScript(AActor *who,line_t *where,int script,char *map,int *args,int argcount,int flags)

{
  int iVar1;
  level_info_t *i;
  ScriptPtr *code;
  char *pcVar2;
  DLevelScript *this;
  BYTE *pBVar3;
  ulong uVar4;
  ulong uVar5;
  FString local_48;
  int *local_40;
  FBehavior *module;
  
  uVar4 = (ulong)(uint)argcount;
  local_40 = args;
  if ((map == (char *)0x0) || (iVar1 = strncasecmp(level.MapName.Chars,map,8), iVar1 == 0)) {
    module = (FBehavior *)0x0;
    code = FBehavior::StaticFindScript(script,&module);
    if (code == (ScriptPtr *)0x0) {
      if (((flags & 8U) == 0) ||
         ((iVar1 = 0, who != (AActor *)0x0 &&
          (who->player == (player_t *)(&players + (long)consoleplayer * 0x54))))) {
        ScriptPresentation((int)&local_48);
        iVar1 = 0;
        Printf("P_StartScript: Unknown %s\n",local_48.Chars);
        FString::~FString(&local_48);
      }
    }
    else if (((((flags & 8U) == 0) || (netgame != true)) || (sv_cheats.Value != false)) ||
            ((code->Flags & 1) != 0)) {
      this = P_GetScriptGoing(who,where,script,code,module,local_40,argcount,flags);
      if (this == (DLevelScript *)0x0) {
        iVar1 = 0;
      }
      else if ((flags & 4U) == 0) {
        iVar1 = 1;
      }
      else {
        iVar1 = DLevelScript::RunScript(this);
      }
    }
    else {
      pcVar2 = userinfo_t::GetName(&who->player->userinfo);
      ScriptPresentation((int)&local_48);
      Printf(200,"%s tried to puke %s (\n",pcVar2,local_48.Chars);
      FString::~FString(&local_48);
      if (argcount < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        pBVar3 = ", ";
        if (argcount - 1 == uVar5) {
          pBVar3 = "";
        }
        Printf(200,"%d%s",(ulong)(uint)local_40[uVar5],pBVar3);
      }
      iVar1 = 0;
      Printf(200,")\n");
    }
  }
  else {
    iVar1 = 1;
    i = FindLevelInfo(map,true);
    addDefered(i,(uint)flags >> 1 & defexealways,script,local_40,argcount,who);
  }
  return iVar1;
}

Assistant:

int P_StartScript (AActor *who, line_t *where, int script, const char *map, const int *args, int argcount, int flags)
{
	if (map == NULL || 0 == strnicmp (level.MapName, map, 8))
	{
		FBehavior *module = NULL;
		const ScriptPtr *scriptdata;

		if ((scriptdata = FBehavior::StaticFindScript (script, module)) != NULL)
		{
			if ((flags & ACS_NET) && netgame && !sv_cheats)
			{
				// If playing multiplayer and cheats are disallowed, check to
				// make sure only net scripts are run.
				if (!(scriptdata->Flags & SCRIPTF_Net))
				{
					Printf(PRINT_BOLD, "%s tried to puke %s (\n",
						who->player->userinfo.GetName(), ScriptPresentation(script).GetChars());
					for (int i = 0; i < argcount; ++i)
					{
						Printf(PRINT_BOLD, "%d%s", args[i], i == argcount-1 ? "" : ", ");
					}
					Printf(PRINT_BOLD, ")\n");
					return false;
				}
			}
			DLevelScript *runningScript = P_GetScriptGoing (who, where, script,
				scriptdata, module, args, argcount, flags);
			if (runningScript != NULL)
			{
				if (flags & ACS_WANTRESULT)
				{
					return runningScript->RunScript();
				}
				return true;
			}
			return false;
		}
		else
		{
			if (!(flags & ACS_NET) || (who && who->player == &players[consoleplayer]))
			{
				Printf("P_StartScript: Unknown %s\n", ScriptPresentation(script).GetChars());
			}
		}
	}
	else
	{
		addDefered (FindLevelInfo (map),
					(flags & ACS_ALWAYS) ? acsdefered_t::defexealways : acsdefered_t::defexecute,
					script, args, argcount, who);
		return true;
	}
	return false;
}